

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O2

double __thiscall soplex::SSVectorBase<double>::length2(SSVectorBase<double> *this)

{
  double dVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  
  if (this->setupStatus == true) {
    uVar2 = (this->super_IdxSet).num;
    uVar4 = 0;
    uVar3 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar3 = uVar4;
    }
    dVar5 = 0.0;
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      dVar1 = (this->super_VectorBase<double>).val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[(this->super_IdxSet).idx[uVar4]];
      dVar5 = dVar5 + dVar1 * dVar1;
    }
    return dVar5;
  }
  dVar5 = VectorBase<double>::length2(&this->super_VectorBase<double>);
  return dVar5;
}

Assistant:

R length2() const
   {
      R x = 0;

      if(isSetup())
      {
         for(int i = 0; i < num; ++i)
            x += VectorBase<R>::val[idx[i]] * VectorBase<R>::val[idx[i]];
      }
      else
         x = VectorBase<R>::length2();

      return x;
   }